

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_get_max_channel_count(cubeb_conflict *ctx,uint32_t *max_channels)

{
  uint32_t *max_channels_local;
  cubeb_conflict *ctx_local;
  int local_4;
  
  if (ctx->default_sink_info == (cubeb_default_sink_info *)0x0) {
    local_4 = -1;
  }
  else {
    *max_channels = (uint)(ctx->default_sink_info->channel_map).channels;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
pulse_get_max_channel_count(cubeb * ctx, uint32_t * max_channels)
{
  (void)ctx;
  assert(ctx && max_channels);

  if (!ctx->default_sink_info)
    return CUBEB_ERROR;

  *max_channels = ctx->default_sink_info->channel_map.channels;

  return CUBEB_OK;
}